

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O0

bool __thiscall
soplex::SoPlexBase<double>::getPrimalRay(SoPlexBase<double> *this,VectorBase<double> *vector)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  SoPlexBase<double> *in_RDI;
  undefined4 in_stack_ffffffffffffffd8;
  
  bVar1 = hasPrimalRay(in_RDI);
  if (bVar1) {
    iVar2 = VectorBase<double>::dim((VectorBase<double> *)0x449d8d);
    iVar3 = numCols((SoPlexBase<double> *)0x449d9b);
    if (iVar3 <= iVar2) {
      _syncRealSolution(in_RDI);
      SolBase<double>::getPrimalRaySol
                ((SolBase<double> *)in_RDI,
                 (VectorBase<double> *)CONCAT44(iVar2,in_stack_ffffffffffffffd8));
      return true;
    }
  }
  return false;
}

Assistant:

bool SoPlexBase<R>::getPrimalRay(VectorBase<R>& vector)
{
   if(hasPrimalRay() && vector.dim() >= numCols())
   {
      _syncRealSolution();
      _solReal.getPrimalRaySol(vector);
      return true;
   }
   else
      return false;

}